

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O2

void unzip(char *fn)

{
  char cVar1;
  archive_entry *paVar2;
  wchar_t wVar3;
  int iVar4;
  mode_t mVar5;
  int iVar6;
  archive *a;
  la_ssize_t lVar7;
  la_int64_t lVar8;
  int *piVar9;
  long lVar10;
  __ssize_t _Var11;
  uint uVar12;
  char *path;
  char *pcVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  char *local_130;
  archive_entry *e;
  char *local_120;
  undefined8 local_118;
  uint local_10c;
  archive_entry *local_108;
  char *local_100;
  char local_f4 [4];
  time_t local_f0;
  size_t alen;
  long local_e0;
  time_t local_d8;
  long local_d0;
  char *local_c8;
  stat sb;
  
  a = archive_read_new();
  if (a == (archive *)0x0) goto LAB_001048f8;
  wVar3 = archive_read_support_format_zip(a);
  if ((wVar3 == L'\0') &&
     ((O_arg == (char *)0x0 ||
      (wVar3 = archive_read_set_format_option(a,"zip","hdrcharset",O_arg), wVar3 == L'\0')))) {
    if (P_arg == (char *)0x0) {
      archive_read_set_passphrase_callback(a,(void *)0x0,passphrase_callback);
    }
    else {
      archive_read_add_passphrase(a,P_arg);
    }
    wVar3 = archive_read_open_filename(a,fn,0x2000);
    if (wVar3 != L'\0') goto LAB_001048df;
    if (zipinfo_mode == '\0') {
      if ((p_opt == '\0') && ((q_opt & 1) == 0)) {
        printf("Archive:  %s\n",fn);
      }
      if (v_opt == 1) {
        pcVar16 = " --------    %s----   ----    ----\n";
        pcVar13 = "  Length     %sDate   Time    Name\n";
      }
      else {
        if (v_opt != 2) goto LAB_00104017;
        pcVar16 = "--------  ------  ------- -----   %s----   ----   ------    ----\n";
        pcVar13 = " Length   Method    Size  Ratio   %sDate   Time   CRC-32    Name\n";
      }
      printf(pcVar13,y_str);
      printf(pcVar16,y_str);
    }
LAB_00104017:
    local_100 = (char *)0x0;
    lVar14 = 0;
    lVar15 = 0;
    local_c8 = fn;
    while (iVar4 = archive_read_next_header(a,&e), paVar2 = e, iVar4 == 0) {
      if (zipinfo_mode == '\0') {
        if (t_opt == '\x01') {
          mVar5 = archive_entry_filetype(e);
          if ((mVar5 & 0xf000) == 0x4000) {
            uVar17 = 0;
          }
          else {
            pcVar13 = archive_entry_pathname(paVar2);
            info("    testing: %s\t",pcVar13);
            do {
              lVar7 = archive_read_data(a,buffer,0x2000);
            } while (0 < lVar7);
            if (lVar7 < 0) {
              pcVar13 = archive_error_string(a);
              info(" %s\n",pcVar13);
            }
            else {
              info(" OK\n");
            }
            uVar17 = (ulong)(lVar7 < 0);
            iVar4 = archive_read_data_skip(a);
            if (iVar4 != 0) goto LAB_001048df;
          }
          local_100 = local_100 + uVar17;
        }
        else {
          if (v_opt != 0) goto LAB_00104094;
          if ((p_opt == '\0') && ((c_opt & 1) == 0)) {
            pcVar13 = archive_entry_pathname(e);
            pcVar13 = pathdup(pcVar13);
            if (pcVar13 == (char *)0x0) {
              warningx("skipping empty or unreadable filename entry");
              iVar4 = archive_read_data_skip(a);
              goto joined_r0x0010429a;
            }
            local_108 = paVar2;
            local_120 = pcVar13;
            mVar5 = archive_entry_filetype(paVar2);
            if ((*local_120 == '/') ||
               ((((*local_120 == '.' && (local_120[1] == '.')) && (local_120[2] == '/')) ||
                (pcVar13 = strstr(local_120,"/../"), pcVar13 != (char *)0x0)))) {
              pcVar13 = "skipping insecure entry \'%s\'";
            }
            else {
              uVar12 = mVar5 & 0xf000;
              if (((uVar12 == 0x4000) || (uVar12 == 0x8000)) || (uVar12 == 0xa000)) {
                if (((uVar12 == 0x4000) && ((j_opt & 1) != 0)) ||
                   (iVar4 = accept_pathname(local_120), iVar4 == 0)) {
                  iVar4 = archive_read_data_skip(a);
                  if (iVar4 != 0) goto LAB_001048df;
                }
                else {
                  local_118 = (char *)(CONCAT44(local_118._4_4_,mVar5) & 0xffffffff0000f000);
                  pcVar13 = local_120;
                  pcVar16 = local_120;
                  path = local_120;
                  if (j_opt == 1) {
                    do {
                      do {
                        path = pcVar16;
                        pcVar16 = pcVar13 + 1;
                        cVar1 = *pcVar13;
                        pcVar13 = pcVar16;
                      } while (cVar1 == '/');
                      pcVar16 = path;
                    } while (cVar1 != '\0');
                  }
                  pcVar13 = pathcat(d_arg,path);
                  local_130 = pcVar13;
                  make_parent(pcVar13);
                  paVar2 = local_108;
                  if ((int)local_118 == 0x4000) {
                    if (*pcVar13 != '\0') {
                      mVar5 = archive_entry_mode(local_108);
                      uVar12 = mVar5 & 0x1ff | 0x1c0;
                      if ((mVar5 & 0x1ff) == 0) {
                        uVar12 = 0x1ed;
                      }
                      info("   creating: %s/\n",pcVar13);
                      iVar4 = lstat(pcVar13,(stat *)&sb);
                      if (iVar4 == 0) {
                        if ((sb.st_mode & 0xf000) != 0x4000) {
                          unlink(pcVar13);
                          goto LAB_0010441b;
                        }
                      }
                      else {
LAB_0010441b:
                        iVar4 = mkdir(pcVar13,uVar12 >> 2 & 9 | uVar12);
                        if ((iVar4 != 0) && (piVar9 = __errno_location(), *piVar9 != 0x11)) {
                          pcVar16 = "mkdir(\'%s\')";
LAB_0010494c:
                          error(pcVar16,pcVar13);
                        }
                      }
                      iVar4 = archive_read_data_skip(a);
                      if (iVar4 != 0) goto LAB_001048df;
                    }
                  }
                  else {
                    local_118 = pcVar13;
                    mVar5 = archive_entry_mode(local_108);
                    local_10c = mVar5 & 0x1ff;
                    if (local_10c == 0) {
                      local_10c = 0x1a4;
                    }
                    local_f0 = archive_entry_mtime(paVar2);
                    lVar10 = archive_entry_mtime_nsec(paVar2);
                    while (iVar4 = lstat(local_118,(stat *)&sb), iVar4 == 0) {
                      if ((u_opt != '\0') || ((f_opt & 1) != 0)) {
                        if (((sb.st_mode & 0xf000) == 0x8000) &&
                           ((local_f0 < sb.st_mtim.tv_sec ||
                            ((sb.st_mtim.tv_sec == local_f0 && (lVar10 <= sb.st_mtim.tv_nsec))))))
                        goto LAB_00104771;
LAB_001045e2:
                        unlink(local_130);
                        goto LAB_001045ec;
                      }
                      if (o_opt == '\x01') goto LAB_001045e2;
                      if (n_opt != '\0') goto LAB_00104771;
                      while( true ) {
                        fprintf(_stderr,"replace %s? [y]es, [n]o, [A]ll, [N]one, [r]ename: ",
                                local_130);
                        pcVar13 = fgets(local_f4,4,_stdin);
                        if (pcVar13 == (char *)0x0) goto LAB_0010474f;
                        if (local_f4[0] == 'y') goto LAB_001045e2;
                        if (local_f4[0] == 'N') goto LAB_0010476a;
                        if (local_f4[0] == 'R') break;
                        if (local_f4[0] == 'Y') goto LAB_001045e2;
                        if (local_f4[0] == 'n') goto LAB_00104771;
                        if (local_f4[0] == 'r') break;
                        if (local_f4[0] == 'A') {
                          o_opt = '\x01';
                          goto LAB_001045e2;
                        }
                      }
                      printf("New name: ");
                      fflush(_stdout);
                      free(local_130);
                      local_130 = (char *)0x0;
                      alen = 0;
                      _Var11 = getline(&local_130,&alen,_stdin);
                      if (_Var11 < 1) {
LAB_0010474f:
                        clearerr(_stdin);
                        puts("NULL\n(EOF or read error, treating as \"[N]one\"...)");
LAB_0010476a:
                        n_opt = '\x01';
                        goto LAB_00104771;
                      }
                      if (local_130[_Var11 + -1] == '\n') {
                        local_130[_Var11 + -1] = '\0';
                        local_118 = local_130;
                      }
                      else {
                        local_118 = local_130;
                      }
                    }
                    if (f_opt == 0) {
LAB_001045ec:
                      alen = 0;
                      local_e0 = 0x3fffffff;
                      local_d8 = local_f0;
                      local_d0 = lVar10;
                      pcVar13 = archive_entry_symlink(local_108);
                      if (pcVar13 == (char *)0x0) {
                        iVar4 = open(local_130,0x242,(ulong)local_10c);
                        if (iVar4 < 0) {
                          pcVar16 = "open(\'%s\')";
                          pcVar13 = local_130;
                          goto LAB_0010494c;
                        }
                        info(" extracting: %s",local_130);
                        iVar6 = extract2fd(a,local_130,iVar4);
                        if (tty == '\x01') {
                          info("  \b\b");
                        }
                        if (iVar6 != 0) {
                          info(" (text)");
                        }
                        info("\n");
                        iVar6 = futimens(iVar4,(timespec *)&alen);
                        if (iVar6 != 0) {
                          pcVar16 = "futimens(\'%s\')";
                          pcVar13 = local_130;
                          goto LAB_0010494c;
                        }
                        iVar4 = close(iVar4);
                        if (iVar4 != 0) {
                          pcVar16 = "close(\'%s\')";
                          pcVar13 = local_130;
                          goto LAB_0010494c;
                        }
                      }
                      else {
                        iVar4 = symlink(pcVar13,local_130);
                        if (iVar4 != 0) {
                          pcVar16 = "symlink(\'%s\')";
                          pcVar13 = local_130;
                          goto LAB_0010494c;
                        }
                        info(" extracting: %s -> %s\n",local_130,pcVar13);
                        iVar4 = lchmod(local_130,local_10c);
                        if (iVar4 != 0) {
                          warning("Cannot set mode for \'%s\'",local_130);
                        }
                        iVar4 = utimensat(-100,local_130,(timespec *)&alen,0x100);
                        if (iVar4 != 0) {
                          warning("utimensat(\'%s\')",local_130);
                        }
                      }
                    }
                  }
LAB_00104771:
                  free(local_130);
                }
                free(local_120);
                goto LAB_00104268;
              }
              pcVar13 = "skipping non-regular entry \'%s\'";
            }
            pcVar16 = local_120;
            warningx(pcVar13,local_120);
            iVar4 = archive_read_data_skip(a);
            if (iVar4 == 0) {
              free(pcVar16);
              goto LAB_00104268;
            }
            goto LAB_001048df;
          }
          pcVar13 = archive_entry_pathname(e);
          pcVar13 = pathdup(pcVar13);
          if (pcVar13 == (char *)0x0) {
            warningx("skipping empty or unreadable filename entry");
            iVar4 = archive_read_data_skip(a);
joined_r0x0010429a:
            if (iVar4 == 0) goto LAB_00104268;
            goto LAB_001048df;
          }
          mVar5 = archive_entry_filetype(paVar2);
          uVar12 = mVar5 & 0xf000;
          if ((short)uVar12 == 0x4000) {
LAB_001042d1:
            iVar4 = archive_read_data_skip(a);
            if (iVar4 != 0) goto LAB_001048df;
          }
          else {
            if ((uVar12 != 0x8000) && (uVar12 != 0xa000)) {
              warningx("skipping non-regular entry \'%s\'",pcVar13);
              goto LAB_001042d1;
            }
            iVar4 = accept_pathname(pcVar13);
            if (iVar4 == 0) goto LAB_001042d1;
            if (c_opt == 1) {
              info("x %s\n",pcVar13);
            }
            extract2fd(a,pcVar13,1);
          }
          free(pcVar13);
        }
      }
      else if (Z1_opt == '\x01') {
LAB_00104094:
        list(a,e);
      }
LAB_00104268:
      lVar8 = archive_entry_size(e);
      lVar15 = lVar15 + lVar8;
      lVar14 = lVar14 + 1;
    }
    if (iVar4 != 1) goto LAB_001048df;
    if (zipinfo_mode == '\x01') {
      if (v_opt == 2) {
        printf("--------          -------  ---                            %s-------\n",y_str);
        pcVar13 = "s";
        if (lVar14 == 1) {
          pcVar13 = "";
        }
        printf("%8ju          %7ju   0%%                            %s%ju file%s\n",lVar15,lVar15,
               y_str,lVar14,pcVar13);
      }
      else if (v_opt == 1) {
        printf(" --------                   %s-------\n",y_str);
        pcVar13 = "s";
        if (lVar14 == 1) {
          pcVar13 = "";
        }
        printf(" %8ju                   %s%ju file%s\n",lVar15,y_str,lVar14,pcVar13);
      }
    }
    iVar4 = archive_read_free(a);
    if (iVar4 != 0) goto LAB_001048df;
    free(passphrase_buf);
    if (t_opt != '\x01') {
      return;
    }
    if (local_100 == (char *)0x0) {
      printf("No errors detected in compressed data of %s.\n",local_c8);
      return;
    }
    pcVar16 = "%ju checksum error(s) found.";
    pcVar13 = local_100;
  }
  else {
LAB_001048df:
    pcVar13 = archive_error_string(a);
    pcVar16 = "%s";
  }
  errorx(pcVar16,pcVar13);
LAB_001048f8:
  error("archive_read_new failed");
}

Assistant:

static void
unzip(const char *fn)
{
	struct archive *a;
	struct archive_entry *e;
	int ret;
	uintmax_t total_size, file_count, error_count;

	if ((a = archive_read_new()) == NULL)
		error("archive_read_new failed");

	ac(archive_read_support_format_zip(a));

	if (O_arg)
		ac(archive_read_set_format_option(a, "zip", "hdrcharset", O_arg));

	if (P_arg)
		archive_read_add_passphrase(a, P_arg);
	else
		archive_read_set_passphrase_callback(a, NULL,
			&passphrase_callback);

	ac(archive_read_open_filename(a, fn, 8192));

	if (!zipinfo_mode) {
		if (!p_opt && !q_opt)
			printf("Archive:  %s\n", fn);
		if (v_opt == 1) {
			printf("  Length     %sDate   Time    Name\n", y_str);
			printf(" --------    %s----   ----    ----\n", y_str);
		} else if (v_opt == 2) {
			printf(" Length   Method    Size  Ratio   %sDate   Time   CRC-32    Name\n", y_str);
			printf("--------  ------  ------- -----   %s----   ----   ------    ----\n", y_str);
		}
	}

	total_size = 0;
	file_count = 0;
	error_count = 0;
	for (;;) {
		ret = archive_read_next_header(a, &e);
		if (ret == ARCHIVE_EOF)
			break;
		ac(ret);
		if (!zipinfo_mode) {
			if (t_opt)
				error_count += test(a, e);
			else if (v_opt)
				list(a, e);
			else if (p_opt || c_opt)
				extract_stdout(a, e);
			else
				extract(a, e);
		} else {
			if (Z1_opt)
				list(a, e);
		}

		total_size += archive_entry_size(e);
		++file_count;
	}

	if (zipinfo_mode) {
		if (v_opt == 1) {
			printf(" --------                   %s-------\n", y_str);
			printf(" %8ju                   %s%ju file%s\n",
			    total_size, y_str, file_count, file_count != 1 ? "s" : "");
		} else if (v_opt == 2) {
			printf("--------          -------  ---                            %s-------\n", y_str);
			printf("%8ju          %7ju   0%%                            %s%ju file%s\n",
			    total_size, total_size, y_str, file_count,
			    file_count != 1 ? "s" : "");
		}
	}

	ac(archive_read_free(a));

	if (passphrase_buf != NULL) {
		memset(passphrase_buf, 0, PPBUFF_SIZE);
		free(passphrase_buf);
	}

	if (t_opt) {
		if (error_count > 0) {
			errorx("%ju checksum error(s) found.", error_count);
		}
		else {
			printf("No errors detected in compressed data of %s.\n",
			       fn);
		}
	}
}